

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_list.h
# Opt level: O0

iterator * __thiscall obs::safe_list<obs::slot<int_(int)>_>::iterator::operator++(iterator *this)

{
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> l;
  iterator *this_local;
  
  l._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->m_list->m_mutex_nodes);
  if (this->m_node == (node *)0x0) {
    __assert_fail("m_node",
                  "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/safe_list.h"
                  ,0xc4,
                  "iterator &obs::safe_list<obs::slot<int (int)>>::iterator::operator++() [T = obs::slot<int (int)>]"
                 );
  }
  if (this->m_node != (node *)0x0) {
    unlock(this);
    this->m_node = this->m_node->next;
    if (this->m_node != (node *)0x0) {
      lock(this);
    }
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return this;
}

Assistant:

iterator& operator++() {
      std::lock_guard<std::mutex> l(m_list.m_mutex_nodes);
      assert(m_node);
      if (m_node) {
        unlock();

        // Go to the next node.
        m_node = m_node->next;

        // Lock the new node that we're pointing to now.
        if (m_node)
          lock();
      }
      return *this;
    }